

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

string * __thiscall
cmCTestVC::GetNightlyTime_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this)

{
  cmCTest *this_00;
  bool tomorrowtag;
  tm *ptVar1;
  allocator<char> local_479;
  char local_478 [8];
  char current_time [1024];
  allocator<char> local_61;
  string local_60;
  string local_40;
  tm *local_20;
  tm *t;
  cmCTestVC *this_local;
  
  this_00 = this->CTest;
  t = (tm *)this;
  this_local = (cmCTestVC *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"NightlyStartTime",&local_61);
  cmCTest::GetCTestConfiguration(&local_40,this_00,&local_60);
  tomorrowtag = cmCTest::GetTomorrowTag(this->CTest);
  ptVar1 = cmCTest::GetNightlyTime(this_00,&local_40,tomorrowtag);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_20 = ptVar1;
  sprintf(local_478,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          ptVar1->tm_min,ptVar1->tm_sec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_478,&local_479);
  std::allocator<char>::~allocator(&local_479);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::GetNightlyTime()
{
  // Get the nightly start time corresponding to the current dau.
  struct tm* t = this->CTest->GetNightlyTime(
    this->CTest->GetCTestConfiguration("NightlyStartTime"),
    this->CTest->GetTomorrowTag());
  char current_time[1024];
  sprintf(current_time, "%04d-%02d-%02d %02d:%02d:%02d", t->tm_year + 1900,
          t->tm_mon + 1, t->tm_mday, t->tm_hour, t->tm_min, t->tm_sec);
  return std::string(current_time);
}